

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::setScientificNotation(DecimalFormat *this,UBool useScientific)

{
  DecimalFormatProperties *pDVar1;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->minimumExponentDigits != (-(uint)(useScientific == '\0') | 1)) {
    pDVar1->minimumExponentDigits = -(uint)(useScientific == '\0') | 1;
    uStack_8 = 0;
    touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setScientificNotation(UBool useScientific) {
    int32_t minExp = useScientific ? 1 : -1;
    if (fields->properties->minimumExponentDigits == minExp) { return; }
    if (useScientific) {
        fields->properties->minimumExponentDigits = 1;
    } else {
        fields->properties->minimumExponentDigits = -1;
    }
    touchNoError();
}